

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

void CompilationContext::globalError(char *error)

{
  char *in_RDI;
  CompilerMessage cm;
  CompilerMessage *in_stack_ffffffffffffff90;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  string local_50 [32];
  string local_30 [32];
  undefined1 local_10;
  char *local_8;
  
  local_8 = in_RDI;
  setErrorLevel(4);
  if (redirectMessagesToJson == (char *)0x0) {
    fprintf((FILE *)out_stream,"ERROR: %s\n",local_8);
  }
  CompilerMessage::CompilerMessage(in_stack_ffffffffffffff90);
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  local_10 = 1;
  std::__cxx11::string::operator=(local_50,local_8);
  std::__cxx11::string::operator=(local_30,"");
  std::vector<CompilerMessage,_std::allocator<CompilerMessage>_>::push_back
            ((vector<CompilerMessage,_std::allocator<CompilerMessage>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,uVar3),(value_type *)CONCAT44(uVar2,uVar1));
  CompilerMessage::~CompilerMessage(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void CompilationContext::globalError(const char * error)
{
  CompilationContext::setErrorLevel(ERRORLEVEL_FATAL);

  if (!redirectMessagesToJson)
    fprintf(out_stream, "ERROR: %s\n", error);

  CompilerMessage cm;
  cm.line = 0;
  cm.column = 0;
  cm.intId = 0;
  cm.isError = true;
  cm.message = error;
  cm.fileName = "";
  compilerMessages.push_back(cm);
}